

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_libpd.c
# Opt level: O0

int libpd_aftertouch(int channel,int value)

{
  int value_local;
  int channel_local;
  
  if (channel < 0) {
    value_local = -1;
  }
  else if ((value < 0) || (0x7f < value)) {
    value_local = -1;
  }
  else {
    sys_lock();
    inmidi_aftertouch(channel >> 4,channel & 0xf,value);
    sys_unlock();
    value_local = 0;
  }
  return value_local;
}

Assistant:

int libpd_aftertouch(int channel, int value) {
  CHECK_CHANNEL
  CHECK_RANGE_7BIT(value)
  sys_lock();
  inmidi_aftertouch(PORT, CHANNEL, value);
  sys_unlock();
  return 0;
}